

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_neon_trn_u8(TCGContext_conflict1 *tcg_ctx,TCGv_i32 t0,TCGv_i32 t1)

{
  TCGTemp *a1;
  TCGTemp *a3;
  uintptr_t o;
  uintptr_t o_2;
  TCGv_i32 ret;
  uintptr_t o_3;
  TCGv_i32 ret_00;
  uintptr_t o_1;
  
  a1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)a1 - (long)tcg_ctx);
  a3 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a3 - (long)tcg_ctx);
  tcg_gen_shli_i32_aarch64(tcg_ctx,ret_00,t0,8);
  tcg_gen_andi_i32_aarch64(tcg_ctx,ret_00,ret_00,-0xff0100);
  tcg_gen_andi_i32_aarch64(tcg_ctx,ret,t1,0xff00ff);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_or_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
  tcg_gen_shri_i32_aarch64(tcg_ctx,t1,t1,8);
  tcg_gen_andi_i32_aarch64(tcg_ctx,t1,t1,0xff00ff);
  tcg_gen_andi_i32_aarch64(tcg_ctx,ret,t0,-0xff0100);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_or_i32,(TCGArg)(t1 + (long)tcg_ctx),
                      (TCGArg)(t1 + (long)tcg_ctx),(TCGArg)a3);
  if (ret_00 != t0) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(t0 + (long)tcg_ctx),(TCGArg)a1);
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_neon_trn_u8(TCGContext *tcg_ctx, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 rd, tmp;

    rd = tcg_temp_new_i32(tcg_ctx);
    tmp = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_shli_i32(tcg_ctx, rd, t0, 8);
    tcg_gen_andi_i32(tcg_ctx, rd, rd, 0xff00ff00);
    tcg_gen_andi_i32(tcg_ctx, tmp, t1, 0x00ff00ff);
    tcg_gen_or_i32(tcg_ctx, rd, rd, tmp);

    tcg_gen_shri_i32(tcg_ctx, t1, t1, 8);
    tcg_gen_andi_i32(tcg_ctx, t1, t1, 0x00ff00ff);
    tcg_gen_andi_i32(tcg_ctx, tmp, t0, 0xff00ff00);
    tcg_gen_or_i32(tcg_ctx, t1, t1, tmp);
    tcg_gen_mov_i32(tcg_ctx, t0, rd);

    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_temp_free_i32(tcg_ctx, rd);
}